

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

String * doctest::toString<double>(IsNaN<double> in)

{
  String *in_RDI;
  String *this;
  char *in_stack_ffffffffffffff48;
  String *in_stack_ffffffffffffff50;
  String *in_stack_ffffffffffffff80;
  String *in_stack_ffffffffffffff88;
  
  this = in_RDI;
  String::String(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  String::String(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  toString((double)in_RDI);
  operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  String::String(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  String::~String(this);
  String::~String(this);
  String::~String(this);
  String::~String(this);
  String::~String(this);
  String::~String(this);
  return this;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }